

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O2

wchar_t cmd_get_quantity(command_conflict *cmd,char *arg,int *amt,wchar_t max)

{
  wchar_t wVar1;
  wchar_t wVar2;
  
  wVar1 = cmd_get_arg_number(cmd,arg,amt);
  wVar2 = L'\0';
  if (wVar1 != L'\0') {
    wVar1 = get_quantity((char *)0x0,max);
    *amt = wVar1;
    if (wVar1 < L'\x01') {
      wVar2 = L'\xfffffffd';
    }
    else {
      cmd_set_arg_number(cmd,arg,wVar1);
    }
  }
  return wVar2;
}

Assistant:

int cmd_get_quantity(struct command *cmd, const char *arg, int *amt, int max)
{
	if (cmd_get_arg_number(cmd, arg, amt) == CMD_OK)
		return CMD_OK;

	*amt = get_quantity(NULL, max);
	if (*amt > 0) {
		cmd_set_arg_number(cmd, arg, *amt);
		return CMD_OK;
	}

	return CMD_ARG_ABORTED;
}